

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O0

void HSendPacket(int node,int len)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  uint uVar3;
  PacketStore *pPVar4;
  char local_3701;
  uint local_36ec;
  undefined1 local_36e8 [4];
  uint i_1;
  PacketStore store;
  int numtics;
  int realretrans;
  int k;
  int i;
  int len_local;
  int node_local;
  
  if ((debugfile != (FILE *)0x0) && (node != 0)) {
    if ((doomcom.data[0] & 0x20) == 0) {
      if ((doomcom.data[0] & 0x80) == 0) {
        numtics = 2;
        if (((NetMode == '\x01') && (consoleplayer == Net_Arbitrator)) && (node != 0)) {
          numtics = 3;
        }
        if ((doomcom.data[0] & 0x40) == 0) {
          store.message.data[0x36ac] = 0xff;
          store.message.data[0x36ad] = 0xff;
          store.message.data[0x36ae] = 0xff;
          store.message.data[13999] = 0xff;
        }
        else {
          store.message.data._13996_4_ = ExpandTics((uint)doomcom.data[numtics]);
          numtics = numtics + 1;
        }
        iVar2 = gametic;
        iVar1 = maketic;
        __stream = debugfile;
        store.message.data._13992_4_ = doomcom.data[0] & 3;
        if (store.message.data._13992_4_ == 3) {
          store.message.data._13992_4_ = doomcom.data[numtics] + 3;
          numtics = numtics + 1;
        }
        uVar3 = ExpandTics((uint)doomcom.data[1]);
        fprintf((FILE *)__stream,"%i/%i send %i = (%i + %i, R %i) [%3i]",(ulong)(uint)iVar2,
                (ulong)(uint)iVar1,(ulong)(uint)node,(ulong)uVar3,store.message.data._13992_4_,
                store.message.data._13996_4_,len);
        for (realretrans = 0; realretrans < len; realretrans = realretrans + 1) {
          local_3701 = '|';
          if (realretrans != numtics) {
            local_3701 = ' ';
          }
          fprintf((FILE *)debugfile,"%c%2x",(ulong)(uint)(int)local_3701,
                  (ulong)doomcom.data[realretrans]);
        }
      }
      else {
        fprintf((FILE *)debugfile,"%i/%i send %i = EXIT [%3i]",(ulong)(uint)gametic,
                (ulong)(uint)maketic,(ulong)(uint)node,(ulong)(uint)len);
        for (realretrans = 0; realretrans < len; realretrans = realretrans + 1) {
          fprintf((FILE *)debugfile," %2x",(ulong)doomcom.data[realretrans]);
        }
      }
    }
    else {
      fprintf((FILE *)debugfile,"%i/%i send %i = SETUP [%3i]",(ulong)(uint)gametic,
              (ulong)(uint)maketic,(ulong)(uint)node,(ulong)(uint)len);
      for (realretrans = 0; realretrans < len; realretrans = realretrans + 1) {
        fprintf((FILE *)debugfile," %2x",(ulong)doomcom.data[realretrans]);
      }
    }
    fprintf((FILE *)debugfile," [[ ");
    for (realretrans = 0; realretrans < doomcom.numnodes; realretrans = realretrans + 1) {
      if ((nodeingame[realretrans] & 1U) == 0) {
        fprintf((FILE *)debugfile,"--- ");
      }
      else {
        fprintf((FILE *)debugfile,"%d ",(ulong)(uint)nettics[realretrans]);
      }
    }
    fprintf((FILE *)debugfile,"]]\n");
  }
  if (node == 0) {
    memcpy(reboundstore,doomcom.data,(long)len);
    reboundpacket = len;
  }
  else if ((demoplayback & 1U) == 0) {
    if ((netgame & 1U) == 0) {
      I_Error("Tried to transmit to another node");
    }
    doomcom.command = 1;
    doomcom.remotenode = (SWORD)node;
    doomcom.datalength = (SWORD)len;
    iVar1 = FIntCVar::operator_cast_to_int(&net_fakelatency);
    if (iVar1 / 2 < 1) {
      I_NetCmd();
    }
    else {
      memcpy(&i_1,&doomcom,0x36c4);
      iVar1 = (*I_GetTime)(false);
      iVar2 = FIntCVar::operator_cast_to_int(&net_fakelatency);
      local_36e8 = (undefined1  [4])
                   (iVar1 + (int)((long)((ulong)(uint)((int)((long)iVar2 / 2) >> 0x1f) << 0x20 |
                                        (long)iVar2 / 2 & 0xffffffffU) / 0x1c));
      TArray<PacketStore,_PacketStore>::Push(&OutBuffer,(PacketStore *)local_36e8);
    }
    for (local_36ec = 0; uVar3 = TArray<PacketStore,_PacketStore>::Size(&OutBuffer),
        local_36ec < uVar3; local_36ec = local_36ec + 1) {
      pPVar4 = TArray<PacketStore,_PacketStore>::operator[](&OutBuffer,(ulong)local_36ec);
      iVar1 = pPVar4->timer;
      iVar2 = (*I_GetTime)(false);
      if (iVar1 <= iVar2) {
        pPVar4 = TArray<PacketStore,_PacketStore>::operator[](&OutBuffer,(ulong)local_36ec);
        memcpy(&doomcom,&pPVar4->message,0x36c4);
        I_NetCmd();
        TArray<PacketStore,_PacketStore>::Delete(&OutBuffer,local_36ec);
        local_36ec = 0xffffffff;
      }
    }
  }
  return;
}

Assistant:

void HSendPacket (int node, int len)
{
	if (debugfile && node != 0)
	{
		int i, k, realretrans;

		if (netbuffer[0] & NCMD_SETUP)
		{
			fprintf (debugfile,"%i/%i send %i = SETUP [%3i]", gametic, maketic, node, len);
			for (i = 0; i < len; i++)
				fprintf (debugfile," %2x", ((BYTE *)netbuffer)[i]);
		}
		else if (netbuffer[0] & NCMD_EXIT)
		{
			fprintf (debugfile,"%i/%i send %i = EXIT [%3i]", gametic, maketic, node, len);
			for (i = 0; i < len; i++)
				fprintf (debugfile," %2x", ((BYTE *)netbuffer)[i]);
		}
		else
		{
			k = 2;

			if (NetMode == NET_PacketServer && consoleplayer == Net_Arbitrator &&
				node != 0)
			{
				k++;
			}

			if (netbuffer[0] & NCMD_RETRANSMIT)
				realretrans = ExpandTics (netbuffer[k++]);
			else
				realretrans = -1;

			int numtics = netbuffer[0] & 3;
			if (numtics == 3)
				numtics += netbuffer[k++];

			fprintf (debugfile,"%i/%i send %i = (%i + %i, R %i) [%3i]",
					gametic, maketic,
					node,
					ExpandTics(netbuffer[1]),
					numtics, realretrans, len);
			
			for (i = 0; i < len; i++)
				fprintf (debugfile, "%c%2x", i==k?'|':' ', ((BYTE *)netbuffer)[i]);
		}
		fprintf (debugfile, " [[ ");
		for (i = 0; i < doomcom.numnodes; ++i)
		{
			if (nodeingame[i])
			{
				fprintf (debugfile, "%d ", nettics[i]);
			}
			else
			{
				fprintf (debugfile, "--- ");
			}
		}
		fprintf (debugfile, "]]\n");
	}

	if (node == 0)
	{
		memcpy (reboundstore, netbuffer, len);
		reboundpacket = len;
		return;
	}

	if (demoplayback)
		return;

	if (!netgame)
		I_Error ("Tried to transmit to another node");

#if SIMULATEERRORS
	if (rand() < SIMULATEERRORS)
	{
		if (debugfile)
			fprintf (debugfile, "Drop!\n");
		return;
	}
#endif

	doomcom.command = CMD_SEND;
	doomcom.remotenode = node;
	doomcom.datalength = len;

#ifdef _DEBUG
	if (net_fakelatency / 2 > 0)
	{
		PacketStore store;
		store.message = doomcom;
		store.timer = I_GetTime(false) + ((net_fakelatency / 2) / (1000 / TICRATE));
		OutBuffer.Push(store);
	}
	else
		I_NetCmd();

	for (unsigned int i = 0; i < OutBuffer.Size(); i++)
	{
		if (OutBuffer[i].timer <= I_GetTime(false))
		{
			doomcom = OutBuffer[i].message;
			I_NetCmd();
			OutBuffer.Delete(i);
			i = -1;
		}
	}
#else
	I_NetCmd();
#endif
}